

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS
ref_swap_node23(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT *node2,REF_INT *node3)

{
  REF_NODE ref_node_00;
  REF_NODE ref_node;
  REF_DBL normal [3];
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_b8;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  uint local_44;
  uint local_40;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_CELL ref_cell;
  REF_INT *node3_local;
  REF_INT *node2_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  unique0x00012000 = ref_grid->cell[3];
  *node2 = -1;
  *node3 = -1;
  ref_grid_local._4_4_ =
       ref_cell_list_with2(unique0x00012000,node0,node1,2,cell_to_swap,(REF_INT *)&local_44);
  if (ref_grid_local._4_4_ == 0) {
    if ((long)cell_to_swap[0] == 2) {
      ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffc8,local_44,(REF_INT *)&local_b8);
      if (ref_grid_local._4_4_ == 0) {
        if ((node0 == local_b8) && (node1 == ref_private_macro_code_rss)) {
          *node2 = nodes[0];
        }
        if ((node0 == ref_private_macro_code_rss) && (node1 == nodes[0])) {
          *node2 = local_b8;
        }
        if ((node0 == nodes[0]) && (node1 == local_b8)) {
          *node2 = ref_private_macro_code_rss;
        }
        if ((node1 == local_b8) && (node0 == ref_private_macro_code_rss)) {
          *node3 = nodes[0];
        }
        if ((node1 == ref_private_macro_code_rss) && (node0 == nodes[0])) {
          *node3 = local_b8;
        }
        if ((node1 == nodes[0]) && (node0 == local_b8)) {
          *node3 = ref_private_macro_code_rss;
        }
        ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffc8,local_40,(REF_INT *)&local_b8)
        ;
        if (ref_grid_local._4_4_ == 0) {
          if ((node0 == local_b8) && (node1 == ref_private_macro_code_rss)) {
            *node2 = nodes[0];
          }
          if ((node0 == ref_private_macro_code_rss) && (node1 == nodes[0])) {
            *node2 = local_b8;
          }
          if ((node0 == nodes[0]) && (node1 == local_b8)) {
            *node2 = ref_private_macro_code_rss;
          }
          if ((node1 == local_b8) && (node0 == ref_private_macro_code_rss)) {
            *node3 = nodes[0];
          }
          if ((node1 == ref_private_macro_code_rss) && (node0 == nodes[0])) {
            *node3 = local_b8;
          }
          if ((node1 == nodes[0]) && (node0 == local_b8)) {
            *node3 = ref_private_macro_code_rss;
          }
          if (*node2 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x124,"ref_swap_node23","node2 not found");
            ref_node_00 = ref_grid->node;
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
            ref_cell_nodes(stack0xffffffffffffffc8,local_44,(REF_INT *)&local_b8);
            ref_node_tri_normal(ref_node_00,(REF_INT *)&local_b8,(REF_DBL *)&ref_node);
            printf("cell %d node %d %d %d %d %f\n",normal[0],(ulong)local_44,(ulong)local_b8,
                   (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_grid->node,local_b8);
            ref_node_location(ref_grid->node,ref_private_macro_code_rss);
            ref_node_location(ref_grid->node,nodes[0]);
            ref_cell_nodes(stack0xffffffffffffffc8,local_40,(REF_INT *)&local_b8);
            ref_node_tri_normal(ref_node_00,(REF_INT *)&local_b8,(REF_DBL *)&ref_node);
            printf("cell %d node %d %d %d %d %f\n",normal[0],(ulong)local_40,(ulong)local_b8,
                   (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_grid->node,local_b8);
            ref_node_location(ref_grid->node,ref_private_macro_code_rss);
            ref_node_location(ref_grid->node,nodes[0]);
            ref_export_by_extension(ref_grid,"ref_swap_node23.tec");
            ref_grid_local._4_4_ = 1;
          }
          else if (*node3 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x136,"ref_swap_node23","node3 not found");
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            printf("node2 %d node3 %d\n",(ulong)(uint)*node2,(ulong)(uint)*node3);
            ref_cell_nodes(stack0xffffffffffffffc8,local_44,(REF_INT *)&local_b8);
            printf("cell %d node %d %d %d %d\n",(ulong)local_44,(ulong)local_b8,
                   (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_grid->node,local_b8);
            ref_node_location(ref_grid->node,ref_private_macro_code_rss);
            ref_node_location(ref_grid->node,nodes[0]);
            ref_cell_nodes(stack0xffffffffffffffc8,local_40,(REF_INT *)&local_b8);
            printf("cell %d node %d %d %d %d\n",(ulong)local_40,(ulong)local_b8,
                   (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)nodes[0],
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_grid->node,local_b8);
            ref_node_location(ref_grid->node,ref_private_macro_code_rss);
            ref_node_location(ref_grid->node,nodes[0]);
            ref_export_by_extension(ref_grid,"ref_swap_node23.tec");
            ref_grid_local._4_4_ = 1;
          }
          else {
            ref_grid_local._4_4_ = 0;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x107,"ref_swap_node23",(ulong)ref_grid_local._4_4_,"nodes tri0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x100,"ref_swap_node23",(ulong)ref_grid_local._4_4_,"nodes tri0");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xfe,
             "ref_swap_node23","there should be two triangles for manifold",2,(long)cell_to_swap[0])
      ;
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xfd,
           "ref_swap_node23",(ulong)ref_grid_local._4_4_,"more then two");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_node23(REF_GRID ref_grid, REF_INT node0,
                                   REF_INT node1, REF_INT *node2,
                                   REF_INT *node3) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  *node2 = REF_EMPTY;
  *node3 = REF_EMPTY;
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri0");
  if (node0 == nodes[0] && node1 == nodes[1]) *node2 = nodes[2];
  if (node0 == nodes[1] && node1 == nodes[2]) *node2 = nodes[0];
  if (node0 == nodes[2] && node1 == nodes[0]) *node2 = nodes[1];
  if (node1 == nodes[0] && node0 == nodes[1]) *node3 = nodes[2];
  if (node1 == nodes[1] && node0 == nodes[2]) *node3 = nodes[0];
  if (node1 == nodes[2] && node0 == nodes[0]) *node3 = nodes[1];

  RUB(REF_EMPTY, *node2, "node2 not found", {
    REF_DBL normal[3];
    REF_NODE ref_node = ref_grid_node(ref_grid);
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    ref_node_tri_normal(ref_node, nodes, normal);
    printf("cell %d node %d %d %d %d %f\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3], normal[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });
  RUB(REF_EMPTY, *node3, "node3 not found", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    printf("node2 %d node3 %d\n", *node2, *node3);
    ref_cell_nodes(ref_cell, cell_to_swap[0], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[0], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_cell_nodes(ref_cell, cell_to_swap[1], nodes);
    printf("cell %d node %d %d %d %d\n", cell_to_swap[1], nodes[0], nodes[1],
           nodes[2], nodes[3]);
    ref_node_location(ref_grid_node(ref_grid), nodes[0]);
    ref_node_location(ref_grid_node(ref_grid), nodes[1]);
    ref_node_location(ref_grid_node(ref_grid), nodes[2]);
    ref_export_by_extension(ref_grid, "ref_swap_node23.tec");
  });

  return REF_SUCCESS;
}